

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

Matrix * __thiscall Matrix::operator*(Matrix *__return_storage_ptr__,Matrix *this,Matrix *a)

{
  float fVar1;
  float fVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference this_00;
  const_reference pvVar5;
  int local_30;
  int local_2c;
  int k;
  int j;
  int i;
  Matrix *a_local;
  Matrix *this_local;
  Matrix *result;
  
  if (this->cols != a->rows) {
    __assert_fail("cols == a.rows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/geometry.cpp"
                  ,0x2b,"Matrix Matrix::operator*(const Matrix &)");
  }
  Matrix(__return_storage_ptr__,this->rows,a->cols);
  for (k = 0; k < this->rows; k = k + 1) {
    for (local_2c = 0; local_2c < a->cols; local_2c = local_2c + 1) {
      pvVar3 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](&__return_storage_ptr__->m,(long)k);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)local_2c);
      *pvVar4 = 0.0;
      for (local_30 = 0; local_30 < this->cols; local_30 = local_30 + 1) {
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](&this->m,(long)k);
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)local_30);
        fVar1 = *pvVar4;
        this_00 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&a->m,(long)local_30);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](this_00,(long)local_2c);
        fVar2 = *pvVar5;
        pvVar3 = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](&__return_storage_ptr__->m,(long)k);
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](pvVar3,(long)local_2c);
        *pvVar4 = fVar1 * fVar2 + *pvVar4;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::operator*(const Matrix &a) {
    assert(cols == a.rows);
    Matrix result(rows, a.cols);
    for (int i = 0; i < rows; i++) {
        for (int j = 0; j < a.cols; j++) {
            result.m[i][j] = 0.f;
            for (int k = 0; k < cols; k++) {
                result.m[i][j] += m[i][k] * a.m[k][j];
            }
        }
    }
    return result;
}